

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

bool __thiscall
duckdb::
QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
::operator()(QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  DataChunk *pDVar1;
  MadAccessor<float,_float,_float> *pMVar2;
  CURSOR *pCVar3;
  ulong uVar4;
  bool bVar5;
  reference pvVar6;
  float fVar7;
  float fVar8;
  
  pMVar2 = this->accessor_l->outer;
  pCVar3 = this->accessor_l->inner->data;
  uVar4 = *lhs;
  if (((pCVar3->scan).next_row_index <= uVar4) || (uVar4 < (pCVar3->scan).current_row_index)) {
    pDVar1 = &pCVar3->page;
    ColumnDataCollection::Seek(pCVar3->inputs,uVar4,&pCVar3->scan,pDVar1);
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    pCVar3->data = (float *)pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    FlatVector::VerifyFlatVector(pvVar6);
    pCVar3->validity = &pvVar6->validity;
  }
  fVar7 = pCVar3->data[(uint)((int)uVar4 - (int)(pCVar3->scan).current_row_index)];
  fVar8 = *pMVar2->median;
  pMVar2 = this->accessor_r->outer;
  pCVar3 = this->accessor_r->inner->data;
  uVar4 = *rhs;
  if (((pCVar3->scan).next_row_index <= uVar4) || (uVar4 < (pCVar3->scan).current_row_index)) {
    pDVar1 = &pCVar3->page;
    ColumnDataCollection::Seek(pCVar3->inputs,uVar4,&pCVar3->scan,pDVar1);
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    pCVar3->data = (float *)pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    FlatVector::VerifyFlatVector(pvVar6);
    pCVar3->validity = &pvVar6->validity;
  }
  fVar7 = ABS(fVar7 - fVar8);
  fVar8 = ABS(pCVar3->data[(uint)((int)uVar4 - (int)(pCVar3->scan).current_row_index)] -
              *pMVar2->median);
  bVar5 = fVar7 < fVar8;
  if (this->desc != false) {
    bVar5 = fVar8 < fVar7;
  }
  return bVar5;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}